

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall
wasm::BinaryInstWriter::emitMemoryAccess
          (BinaryInstWriter *this,size_t alignment,size_t bytes,uint64_t offset,Name memory)

{
  BufferWithRandomAccess *pBVar1;
  Name name;
  Name name_00;
  uint extraout_EAX;
  Module *this_00;
  Memory *this_01;
  double in_XMM0_Qa;
  U32LEB local_7c;
  U64LEB local_78;
  BinaryInstWriter *local_70;
  size_t local_68;
  undefined1 local_59;
  U32LEB local_58;
  LEB<unsigned_int,_unsigned_char> LStack_54;
  bool memory64;
  BinaryInstWriter *local_50;
  size_t local_48;
  uint32_t local_40;
  uint local_3c;
  uint32_t memoryIdx;
  uint32_t alignmentBits;
  uint64_t offset_local;
  size_t bytes_local;
  size_t alignment_local;
  BinaryInstWriter *this_local;
  Name memory_local;
  
  memory_local.super_IString.str._M_len = memory.super_IString.str._M_str;
  this_local = memory.super_IString.str._M_len;
  _memoryIdx = offset;
  offset_local = bytes;
  bytes_local = alignment;
  alignment_local = (size_t)this;
  Bits::log2(in_XMM0_Qa);
  local_50 = this_local;
  local_48 = memory_local.super_IString.str._M_len;
  name_00.super_IString.str._M_str = (char *)memory_local.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)this_local;
  local_3c = extraout_EAX;
  local_40 = WasmBinaryWriter::getMemoryIndex(this->parent,name_00);
  if (local_40 != 0) {
    local_3c = local_3c | 0x40;
  }
  pBVar1 = this->o;
  LEB<unsigned_int,_unsigned_char>::LEB(&stack0xffffffffffffffac,local_3c);
  BufferWithRandomAccess::operator<<(pBVar1,(U32LEB)LStack_54.value);
  if (local_40 != 0) {
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_58,local_40);
    BufferWithRandomAccess::operator<<(pBVar1,local_58);
  }
  this_00 = WasmBinaryWriter::getModule(this->parent);
  local_70 = this_local;
  local_68 = memory_local.super_IString.str._M_len;
  name.super_IString.str._M_str = (char *)memory_local.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)this_local;
  this_01 = Module::getMemory(this_00,name);
  local_59 = Memory::is64(this_01);
  if ((bool)local_59) {
    pBVar1 = this->o;
    LEB<unsigned_long,_unsigned_char>::LEB(&local_78,_memoryIdx);
    BufferWithRandomAccess::operator<<(pBVar1,local_78);
  }
  else {
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB(&local_7c,(uint)_memoryIdx);
    BufferWithRandomAccess::operator<<(pBVar1,local_7c);
  }
  return;
}

Assistant:

void BinaryInstWriter::emitMemoryAccess(size_t alignment,
                                        size_t bytes,
                                        uint64_t offset,
                                        Name memory) {
  uint32_t alignmentBits = Bits::log2(alignment ? alignment : bytes);
  uint32_t memoryIdx = parent.getMemoryIndex(memory);
  if (memoryIdx > 0) {
    // Set bit 6 in the alignment to indicate a memory index is present per:
    // https://github.com/WebAssembly/multi-memory/blob/main/proposals/multi-memory/Overview.md
    alignmentBits = alignmentBits | 1 << 6;
  }
  o << U32LEB(alignmentBits);
  if (memoryIdx > 0) {
    o << U32LEB(memoryIdx);
  }

  bool memory64 = parent.getModule()->getMemory(memory)->is64();
  if (memory64) {
    o << U64LEB(offset);
  } else {
    o << U32LEB(offset);
  }
}